

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O0

void printLogicalImm64(MCInst *MI,uint OpNum,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  cs_ac_type cVar3;
  MCOperand *op;
  uint64_t uVar4;
  SStream *in_RDX;
  uint in_ESI;
  MCInst *in_RDI;
  uint8_t access;
  int64_t Val;
  int64_t in_stack_ffffffffffffffc8;
  SStream *in_stack_ffffffffffffffd0;
  cs_struct *pcVar5;
  uint uVar6;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_fffffffffffffff0;
  
  op = MCInst_getOperand(in_RDI,in_ESI);
  MCOperand_getImm(op);
  uVar4 = AArch64_AM_decodeLogicalImmediate
                    (CONCAT44(in_ESI,in_stack_fffffffffffffff0),(uint)((ulong)in_RDX >> 0x20));
  uVar6 = in_RDI->flat_insn->id;
  if ((((uVar6 == 0xe) || (uVar6 == 0x3f)) || (uVar6 == 200)) || (uVar6 == 0x1b3)) {
    if (((long)uVar4 < 0) || (9 < (long)uVar4)) {
      SStream_concat(in_RDX,"#0x%lx",uVar4);
    }
    else {
      SStream_concat(in_RDX,"#%u",uVar4 & 0xffffffff);
    }
  }
  else {
    printInt64Bang(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  if (in_RDI->csh->detail != CS_OPT_OFF) {
    pcVar5 = in_RDI->csh;
    MCInst_getOpcode(in_RDI);
    cVar3 = get_op_access((cs_struct *)CONCAT44(in_stack_ffffffffffffffdc,uVar6),
                          (uint)((ulong)pcVar5 >> 0x20),(uint)pcVar5);
    in_RDI->flat_insn->detail->groups
    [(ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x45] = (uint8_t)cVar3;
    in_RDI->ac_idx = in_RDI->ac_idx + '\x01';
    puVar1 = in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x2d;
    puVar1[0] = '\x02';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    *(uint64_t *)
     (in_RDI->flat_insn->detail->groups +
     (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x35) = uVar4;
    pcVar2 = in_RDI->flat_insn->detail;
    (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
  }
  return;
}

Assistant:

static void printLogicalImm64(MCInst *MI, unsigned OpNum, SStream *O)
{
	int64_t Val = MCOperand_getImm(MCInst_getOperand(MI, OpNum));
	Val = AArch64_AM_decodeLogicalImmediate(Val, 64);

	switch(MI->flat_insn->id) {
		default:
			printInt64Bang(O, Val);
			break;
		case ARM64_INS_ORR:
		case ARM64_INS_AND:
		case ARM64_INS_EOR:
		case ARM64_INS_TST:
			// do not print number in negative form
			if (Val >= 0 && Val <= HEX_THRESHOLD)
				SStream_concat(O, "#%u", (int)Val);
			else
				SStream_concat(O, "#0x%"PRIx64, Val);
			break;
	}

	if (MI->csh->detail) {
#ifndef CAPSTONE_DIET
		uint8_t access;
		access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
		MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
		MI->ac_idx++;
#endif
		MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
		MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = (int64_t)Val;
		MI->flat_insn->detail->arm64.op_count++;
	}
}